

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

bool iutest::internal::StrNeHelper::Compare<char32_t_const*,std::__cxx11::u32string>
               (char32_t **val1,
               basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *val2)

{
  bool bVar1;
  iu_basic_string_view<char32_t,_std::char_traits<char32_t>_> local_38;
  iu_basic_string_view<char32_t,_std::char_traits<char32_t>_> local_28;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *local_18;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *val2_local;
  char32_t **val1_local;
  
  local_18 = val2;
  val2_local = (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)val1
  ;
  detail::iu_nullable_basic_string_view<char32_t,_std::char_traits<char32_t>_>::
  iu_nullable_basic_string_view
            ((iu_nullable_basic_string_view<char32_t,_std::char_traits<char32_t>_> *)&local_28,*val1
            );
  detail::iu_nullable_basic_string_view<char32_t,std::char_traits<char32_t>>::
  iu_nullable_basic_string_view<std::allocator<char32_t>>
            ((iu_nullable_basic_string_view<char32_t,std::char_traits<char32_t>> *)&local_38,
             local_18);
  bVar1 = StrEqHelper::Compare
                    ((iu_nullable_basic_string_view<char32_t,_std::char_traits<char32_t>_>)local_28,
                     (iu_nullable_basic_string_view<char32_t,_std::char_traits<char32_t>_>)local_38)
  ;
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

inline bool IUTEST_ATTRIBUTE_UNUSED_ Compare(const T1& val1, const T2& val2)
{
    return !StrEqHelper::Compare(val1, val2);
}